

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall
spdlog::details::registry::set_levels(registry *this,log_levels *levels,level_enum *global_level)

{
  iterator iVar1;
  level_enum *plVar2;
  __node_base *p_Var3;
  
  std::mutex::lock(&this->logger_map_mutex_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->log_levels_)._M_h,&levels->_M_h);
  plVar2 = &this->global_log_level_;
  if (global_level != (level_enum *)0x0) {
    plVar2 = global_level;
  }
  this->global_log_level_ = *plVar2;
  p_Var3 = &(this->loggers_)._M_h._M_before_begin;
LAB_002c8a31:
  p_Var3 = p_Var3->_M_nxt;
  if (p_Var3 == (__node_base *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->log_levels_)._M_h,(key_type *)(p_Var3 + 1));
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
      ._M_cur == (__node_type *)0x0) goto LAB_002c8a52;
  plVar2 = (level_enum *)
           ((long)iVar1.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                  ._M_cur + 0x28);
  goto LAB_002c8a5a;
LAB_002c8a52:
  plVar2 = global_level;
  if (global_level != (level_enum *)0x0) {
LAB_002c8a5a:
    LOCK();
    *(level_enum *)&p_Var3[5]._M_nxt[8]._M_nxt = *plVar2;
    UNLOCK();
  }
  goto LAB_002c8a31;
}

Assistant:

SPDLOG_INLINE void registry::set_levels(log_levels levels, level::level_enum *global_level) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    log_levels_ = std::move(levels);
    auto global_level_requested = global_level != nullptr;
    global_log_level_ = global_level_requested ? *global_level : global_log_level_;

    for (auto &logger : loggers_) {
        auto logger_entry = log_levels_.find(logger.first);
        if (logger_entry != log_levels_.end()) {
            logger.second->set_level(logger_entry->second);
        } else if (global_level_requested) {
            logger.second->set_level(*global_level);
        }
    }
}